

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O0

int __thiscall QFbScreen::raise(QFbScreen *this,int __sig)

{
  qsizetype qVar1;
  QWindow *pQVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QWindow *w;
  int index;
  QFbWindow **in_stack_ffffffffffffffb8;
  QFbScreen *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 local_20 [16];
  long *local_10;
  long local_8;
  
  local_10 = (long *)CONCAT44(in_register_00000034,__sig);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = QListSpecialMethodsBase<QFbWindow*>::indexOf<QFbWindow*>
                    ((QListSpecialMethodsBase<QFbWindow_*> *)this,in_stack_ffffffffffffffb8,0x12b2bc
                    );
  if (0 < (int)qVar1) {
    QList<QFbWindow_*>::move
              ((QList<QFbWindow_*> *)CONCAT44((int)qVar1,in_stack_ffffffffffffffd0),
               (qsizetype)in_stack_ffffffffffffffc8,(qsizetype)this);
    local_20 = (**(code **)(*local_10 + 0x30))();
    (**(code **)(*(long *)this + 0xd0))(this,local_20);
    pQVar2 = topWindow(in_stack_ffffffffffffffc8);
    QWindowSystemInterface::handleFocusWindowChanged<QWindowSystemInterface::DefaultDelivery>
              (pQVar2,7);
    (**(code **)(*(long *)this + 0xb8))(this,pQVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QFbScreen::raise(QFbWindow *window)
{
    int index = mWindowStack.indexOf(window);
    if (index <= 0)
        return;
    mWindowStack.move(index, 0);
    setDirty(window->geometry());
    QWindow *w = topWindow();
    QWindowSystemInterface::handleFocusWindowChanged(w);
    topWindowChanged(w);
}